

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O2

void __thiscall
duckdb::AlpCompressionState<float>::Append
          (AlpCompressionState<float> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  float fVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  SelectionVector *pSVar4;
  idx_t iVar5;
  float *pfVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  idx_t i;
  long lVar11;
  idx_t iVar12;
  bool bVar13;
  
  pdVar2 = vdata->data;
  iVar12 = 0;
  while (count != 0) {
    iVar5 = this->vector_idx;
    uVar8 = 0x400 - iVar5;
    if (count <= 0x400 - iVar5) {
      uVar8 = count;
    }
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pSVar4 = vdata->sel;
      pfVar6 = this->input_vector + iVar5;
      iVar7 = iVar12;
      uVar9 = uVar8;
      while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
        psVar3 = pSVar4->sel_vector;
        iVar10 = iVar7;
        if (psVar3 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar3[iVar7];
        }
        *pfVar6 = *(float *)(pdVar2 + iVar10 * 4);
        iVar7 = iVar7 + 1;
        pfVar6 = pfVar6 + 1;
      }
    }
    else {
      lVar11 = 0;
      iVar7 = iVar12;
      uVar9 = uVar8;
      while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
        psVar3 = vdata->sel->sel_vector;
        iVar5 = iVar7;
        if (psVar3 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar3[iVar7];
        }
        fVar1 = *(float *)(pdVar2 + iVar5 * 4);
        bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                           (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar5);
        iVar5 = this->vector_idx;
        iVar10 = this->nulls_idx;
        this->vector_null_positions[iVar10] = (uint16_t)(lVar11 + iVar5);
        this->nulls_idx = !bVar13 + iVar10;
        this->input_vector[lVar11 + iVar5] = fVar1;
        lVar11 = lVar11 + 1;
        iVar7 = iVar7 + 1;
      }
    }
    iVar12 = iVar12 + uVar8;
    count = count - uVar8;
    this->vector_idx = iVar5 + uVar8;
    if (iVar5 + uVar8 == 0x400) {
      CompressVector(this);
    }
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		idx_t values_left_in_data = count;
		idx_t offset_in_data = 0;
		while (values_left_in_data > 0) {
			// We calculate until which value in data we must go to fill the input_vector
			// to avoid checking if input_vector is filled in each iteration
			auto values_to_fill_alp_input =
			    MinValue<idx_t>(AlpConstants::ALP_VECTOR_SIZE - vector_idx, values_left_in_data);
			if (vdata.validity.AllValid()) { //! We optimize a loop when there are no null
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					T value = data[idx];
					input_vector[vector_idx + i] = value;
				}
			} else {
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					T value = data[idx];
					bool is_null = !vdata.validity.RowIsValid(idx);
					//! We resolve null values with a predicated comparison
					vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(vector_idx + i);
					nulls_idx += is_null;
					input_vector[vector_idx + i] = value;
				}
			}
			offset_in_data += values_to_fill_alp_input;
			values_left_in_data -= values_to_fill_alp_input;
			vector_idx += values_to_fill_alp_input;
			// We still need this check since we could have an incomplete input_vector at the end of data
			if (vector_idx == AlpConstants::ALP_VECTOR_SIZE) {
				CompressVector();
				D_ASSERT(vector_idx == 0);
			}
		}
	}